

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall
TimesAll<0,0,0>::propagate_xy_min<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  uint uVar1;
  int iVar2;
  Clause *in_RAX;
  ulong uVar3;
  IntVar *pIVar4;
  ulong uVar5;
  Clause *pCVar6;
  IntVar *pIVar7;
  Clause *pCVar8;
  long lVar9;
  Clause *c;
  Clause *local_38;
  
  pIVar4 = v.var;
  pIVar7 = u.var;
  if (v_max < 0) {
    if (z_min < 1) {
      uVar3 = ~(z_max + v_min);
LAB_001b00cc:
      uVar3 = (long)uVar3 / -v_min;
    }
    else {
      uVar3 = (~v_max + z_max) / v_max;
    }
  }
  else if (v_min < 1) {
    uVar5 = -z_min;
    if (z_min < 1) {
      uVar5 = z_min;
    }
    if (z_max <= (long)uVar5) {
      uVar5 = z_max;
    }
    uVar3 = -z_max;
    if (SBORROW8(uVar5,-z_max) != (long)(uVar5 + z_max) < 0) {
      uVar3 = uVar5;
    }
  }
  else {
    if (z_min < 1) {
      uVar3 = ~z_min + v_min;
      goto LAB_001b00cc;
    }
    uVar3 = ((z_min + v_max) - 1U) / (ulong)v_max;
  }
  pCVar6 = (Clause *)0x1;
  if ((long)(pIVar7->min).v < (long)uVar3) {
    if (so.lazy) {
      local_38 = (Clause *)malloc(0x1c);
      *(uint *)local_38 = *(uint *)local_38 & 0xfc | 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar8 = local_38;
      uVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[8])(pIVar4);
      if (*(uint *)pCVar8 < 0x200) {
LAB_001b01f2:
        abort();
      }
      *(uint *)(pCVar8 + 1) = uVar1;
      iVar2 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[9])(pIVar4);
      if (*(uint *)pCVar8 < 0x300) goto LAB_001b01f2;
      pCVar8[1].data[0].x = iVar2;
      uVar1 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      if (*(uint *)pCVar8 < 0x400) goto LAB_001b01f2;
      *(uint *)(pCVar8 + 2) = uVar1;
      iVar2 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      if (*(uint *)pCVar8 < 0x500) goto LAB_001b01f2;
      pCVar8[2].data[0].x = iVar2;
    }
    else {
      pCVar8 = (Clause *)0x0;
      local_38 = in_RAX;
    }
    lVar9 = uVar3 + (uVar3 == 0);
    if ((pIVar7->min).v < lVar9) {
      pCVar6 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar8 = pCVar6;
      }
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,lVar9,pCVar8,1);
      if ((char)iVar2 == '\0') goto LAB_001b01e1;
    }
    pCVar6 = (Clause *)0x1;
  }
LAB_001b01e1:
  return SUB81(pCVar6,0);
}

Assistant:

bool propagate_xy_min(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// x >= ceil(z / y)
		int64_t u_min_new = 0;
		if (v_max < 0) {
			// Integer variable v is negative
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_max - v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_max - v_min - 1) / -v_min;
			}
		} else if (v_min > 0) {
			// Integer variable is positive
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_min + v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_min + v_min - 1) / -v_min;
			}
		} else {
			// The domain of integer variable v contains -1 and 1
			u_min_new = std::min(-1 * z_min, z_min);
			u_min_new = std::min(u_min_new, z_max);
			u_min_new = std::min(u_min_new, -1 * z_max);
		}

		if (u_min_new > u.getMin()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMin, (u_min_new == 0 ? 1 : u_min_new), reason);
		}

		return true;
	}